

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

Uint32 Diligent::GetPrimitiveCount(PRIMITIVE_TOPOLOGY Topology,Uint32 Elements)

{
  Uint32 UVar1;
  string msg;
  string local_28;
  
  if ((byte)(Topology - PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST) < 0x20) {
    return Elements / (Topology - 9);
  }
  switch(Topology) {
  case PRIMITIVE_TOPOLOGY_UNDEFINED:
    FormatString<char[29]>(&local_28,(char (*) [29])"Undefined primitive topology");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetPrimitiveCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x8bf);
    goto LAB_002ad2a0;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    Elements = Elements / 3;
    break;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
    UVar1 = 2;
    if (2 < Elements) {
      UVar1 = Elements;
    }
    Elements = UVar1 - 2;
    break;
  case PRIMITIVE_TOPOLOGY_POINT_LIST:
    break;
  case PRIMITIVE_TOPOLOGY_LINE_LIST:
    Elements = Elements >> 1;
    break;
  case PRIMITIVE_TOPOLOGY_LINE_STRIP:
    Elements = (Elements - 1) + (uint)(Elements == 0);
    break;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_ADJ:
    Elements = Elements / 6;
    break;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_ADJ:
    UVar1 = 4;
    if (4 < Elements) {
      UVar1 = Elements;
    }
    Elements = UVar1 - 4;
    break;
  case PRIMITIVE_TOPOLOGY_LINE_LIST_ADJ:
    Elements = Elements >> 2;
    break;
  case PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ:
    UVar1 = 3;
    if (3 < Elements) {
      UVar1 = Elements;
    }
    Elements = UVar1 - 3;
    break;
  default:
    FormatString<char[30]>(&local_28,(char (*) [30])"Unexpected primitive topology");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetPrimitiveCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x8cd);
LAB_002ad2a0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    Elements = 0;
  }
  return Elements;
}

Assistant:

inline Uint32 GetPrimitiveCount(PRIMITIVE_TOPOLOGY Topology, Uint32 Elements)
{
    if (Topology >= PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST && Topology <= PRIMITIVE_TOPOLOGY_32_CONTROL_POINT_PATCHLIST)
    {
        return Elements / (Topology - PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST + 1);
    }
    else
    {
        switch (Topology)
        {
            case PRIMITIVE_TOPOLOGY_UNDEFINED:
                UNEXPECTED("Undefined primitive topology");
                return 0;

                // clang-format off
            case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:      return Elements / 3;
            case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:     return (std::max)(Elements, 2u) - 2;
            case PRIMITIVE_TOPOLOGY_POINT_LIST:         return Elements;
            case PRIMITIVE_TOPOLOGY_LINE_LIST:          return Elements / 2;
            case PRIMITIVE_TOPOLOGY_LINE_STRIP:         return (std::max)(Elements, 1u) - 1;
            case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_ADJ:  return Elements / 6;
            case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_ADJ: return (std::max)(Elements, 4u) - 4;
            case PRIMITIVE_TOPOLOGY_LINE_LIST_ADJ:      return Elements / 4;
            case PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ:     return (std::max)(Elements, 3u) - 3;
            // clang-format on
            default: UNEXPECTED("Unexpected primitive topology"); return 0;
        }
    }
}